

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

int main(int argc,char **argv)

{
  char *__s1;
  int iVar1;
  int iVar2;
  DString *pDVar3;
  long lVar4;
  short format;
  void *argtable [5];
  arg_lit *local_58;
  arg_lit *local_50;
  arg_str *local_48;
  arg_file *local_40;
  arg_end *local_38;
  
  a_help = arg_lit0((char *)0x0,"help","display this help and exit");
  local_58 = a_help;
  a_array = arg_lit0("a","array","output as array of arrays");
  local_50 = a_array;
  a_format = arg_str0("f","from","FORMAT",
                      "convert from tabular data format (default CSV), FORMAT = csv|tsv");
  local_48 = a_format;
  a_file = arg_filen((char *)0x0,(char *)0x0,"<FILE>",0,argc + 2,
                     "read input from file(s) -- use stdin if no files given");
  local_40 = a_file;
  a_end = arg_end(0x14);
  local_38 = a_end;
  iVar1 = arg_parse(argc,argv,&local_58);
  if (a_help->count < 1) {
    if (iVar1 < 1) {
      iVar1 = a_array->count;
      if (a_format->count < 1) {
LAB_0010392c:
        format = 0;
      }
      else {
        __s1 = *a_format->sval;
        iVar2 = strcmp(__s1,"csv");
        if (iVar2 == 0) goto LAB_0010392c;
        iVar2 = strcmp(__s1,"tsv");
        format = 1;
        if (iVar2 != 0) {
          fprintf(_stderr,"%s: Unknown input format \'%s\'\n","tdp",__s1);
          goto LAB_0010389a;
        }
      }
      if (a_file->count == 0) {
        iVar2 = 0;
        pDVar3 = stdin_buffer();
        convert_buffer(pDVar3,format,0 < iVar1);
        d_string_free(pDVar3,true);
      }
      else {
        if (0 < a_file->count) {
          lVar4 = 0;
          do {
            pDVar3 = scan_file(a_file->filename[lVar4]);
            if (pDVar3 == (DString *)0x0) {
              main_cold_1();
              goto LAB_0010389a;
            }
            convert_buffer(pDVar3,format,0 < iVar1);
            d_string_free(pDVar3,true);
            lVar4 = lVar4 + 1;
          } while (lVar4 < a_file->count);
        }
        iVar2 = 0;
      }
      goto LAB_0010389f;
    }
    arg_print_errors(_stdout,a_end,"tdp");
  }
  else {
    printf("\n\tUsage: %s","tdp");
    arg_print_syntax(_stdout,&local_58,"\n\n");
    puts("Options:");
    arg_print_glossary(_stdout,&local_58,"\t%-25s %s\n");
    putchar(10);
  }
LAB_0010389a:
  iVar2 = 1;
LAB_0010389f:
  arg_freetable(&local_58,5);
  return iVar2;
}

Assistant:

int main( int argc, char ** argv ) {
	char * binname = "tdp";
	short format = FORMAT_CSV;
	int exitcode = EXIT_SUCCESS;
	bool array_out = false;

	void * argtable[] = {
		a_help			= arg_lit0(NULL, "help", "display this help and exit"),

		a_array			= arg_lit0("a", "array", "output as array of arrays"),

		a_format		= arg_str0("f", "from", "FORMAT", "convert from tabular data format (default CSV), FORMAT = csv|tsv"),

		a_file 			= arg_filen(NULL, NULL, "<FILE>", 0, argc + 2, "read input from file(s) -- use stdin if no files given"),

		a_end 			= arg_end(20),
	};

	int nerrors = arg_parse(argc, argv, argtable);

	if (a_help->count > 0) {
		printf("\n\tUsage: %s", binname);
		arg_print_syntax(stdout, argtable, "\n\n");
		printf("Options:\n");
		arg_print_glossary(stdout, argtable, "\t%-25s %s\n");
		printf("\n");
		exitcode = 1;
		goto exit;
	}

	if (nerrors > 0) {
		arg_print_errors(stdout, a_end, binname);
		exitcode = 1;
		goto exit;
	}

	if (a_array->count > 0) {
		array_out = true;
	}

	if (a_format->count > 0) {
		if (strcmp(a_format->sval[0], "csv") == 0) {
			format = FORMAT_CSV;
		} else if (strcmp(a_format->sval[0], "tsv") == 0) {
			format = FORMAT_TSV;
		} else {
			fprintf(stderr, "%s: Unknown input format '%s'\n", binname, a_format->sval[0]);
			exitcode = 1;
			goto exit;
		}
	}

	DString * buffer;

	if (a_file->count == 0) {
		// Read from stdin
		buffer = stdin_buffer();
		convert_buffer(buffer, format, array_out);
		d_string_free(buffer, true);
	} else {
		// Read from files
		for (int i = 0; i < a_file->count; ++i) {
			buffer = scan_file(a_file->filename[i]);

			if (buffer == NULL) {
				fprintf(stderr, "Error reading file '%s'\n", a_file->filename[i]);
				exitcode = 1;
				goto exit;
			}

			convert_buffer(buffer, format, array_out);
			d_string_free(buffer, true);
		}
	}

exit:
	arg_freetable(argtable, sizeof(argtable) / sizeof(argtable[0]));

	return exitcode;
}